

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<float> Imath_2_5::slerp<float>(Quat<float> *q1,Quat<float> *q2,float t)

{
  float x;
  Quat<float> QVar1;
  Quat<float> q;
  float s;
  float a;
  float in_stack_ffffffffffffff90;
  Quat<float> *in_stack_ffffffffffffffa8;
  Quat<float> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  
  angle4D<float>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  x = sinx_over_x<float>(in_stack_ffffffffffffff90);
  sinx_over_x<float>(x);
  operator*(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  sinx_over_x<float>(x);
  sinx_over_x<float>(x);
  operator*(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  operator+((Quat<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
            in_stack_ffffffffffffffb0);
  QVar1 = Quat<float>::normalized
                    ((Quat<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return QVar1;
}

Assistant:

Quat<T>
slerp (const Quat<T> &q1, const Quat<T> &q2, T t)
{
    //
    // Spherical linear interpolation.
    // Assumes q1 and q2 are normalized and that q1 != -q2.
    //
    // This method does *not* interpolate along the shortest
    // arc between q1 and q2.  If you desire interpolation
    // along the shortest arc, and q1^q2 is negative, then
    // consider calling slerpShortestArc(), below, or flipping
    // the second quaternion explicitly.
    //
    // The implementation of squad() depends on a slerp()
    // that interpolates as is, without the automatic
    // flipping.
    //
    // Don Hatch explains the method we use here on his
    // web page, The Right Way to Calculate Stuff, at
    // http://www.plunk.org/~hatch/rightway.php
    //

    T a = angle4D (q1, q2);
    T s = 1 - t;

    Quat<T> q = sinx_over_x (s * a) / sinx_over_x (a) * s * q1 +
	        sinx_over_x (t * a) / sinx_over_x (a) * t * q2;

    return q.normalized();
}